

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractDOMParser::endAttList(AbstractDOMParser *this,DTDElementDecl *elemDecl)

{
  DOMDocumentImpl *pDVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  XMLCh *pXVar6;
  long *plVar7;
  XMLAttDef *this_00;
  undefined4 extraout_var_01;
  XMLBuffer *this_01;
  undefined4 extraout_var_02;
  XMLCh *pXVar8;
  undefined4 extraout_var_03;
  long *plVar9;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long *plVar10;
  DOMNode *rem;
  DOMNode *remAttr_1;
  DOMNode *remAttr;
  XMLCh temp [1000];
  DOMNode **local_90;
  XMLCh *prefix;
  XMLBuffer *buf;
  XMLBufBid bbQName;
  int index;
  XMLCh *qualifiedName;
  XMLSize_t i;
  bool doNamespaces;
  DOMElementImpl *elemImpl;
  DOMElement *elem;
  DOMAttrImpl *insertAttr;
  XMLAttDef *attr;
  XMLAttDefList *defAttrs;
  DTDElementDecl *elemDecl_local;
  AbstractDOMParser *this_local;
  undefined4 extraout_var_00;
  
  bVar2 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (bVar2) {
    XMLBuffer::append(this->fInternalSubset,L'>');
  }
  uVar4 = (*(elemDecl->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[7])();
  if ((uVar4 & 1) != 0) {
    iVar5 = (*(elemDecl->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[5])();
    plVar10 = (long *)CONCAT44(extraout_var,iVar5);
    pDVar1 = this->fDocument;
    pXVar6 = XMLElementDecl::getFullName(&elemDecl->super_XMLElementDecl);
    iVar5 = (*(pDVar1->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x38])(pDVar1,pXVar6);
    plVar7 = (long *)CONCAT44(extraout_var_00,iVar5);
    bVar2 = XMLScanner::getDoNamespaces(this->fScanner);
    for (qualifiedName = (XMLCh *)0x0; pXVar6 = (XMLCh *)(**(code **)(*plVar10 + 0x50))(),
        qualifiedName < pXVar6; qualifiedName = (XMLCh *)((long)qualifiedName + 1)) {
      this_00 = (XMLAttDef *)(**(code **)(*plVar10 + 0x58))(plVar10,qualifiedName);
      pXVar6 = XMLAttDef::getValue(this_00);
      if (pXVar6 != (XMLCh *)0x0) {
        if (bVar2) {
          iVar5 = (*(this_00->super_XSerializable)._vptr_XSerializable[5])();
          pXVar6 = (XMLCh *)CONCAT44(extraout_var_01,iVar5);
          bbQName.fMgr._4_4_ = DOMDocumentImpl::indexofQualifiedName(pXVar6);
          XMLBufBid::XMLBufBid((XMLBufBid *)&buf,&this->fBufMgr);
          this_01 = XMLBufBid::getBuffer((XMLBufBid *)&buf);
          if (bbQName.fMgr._4_4_ < 1) {
            bVar3 = XMLString::equals(pXVar6,L"xmlns");
            if (bVar3) {
              XMLBuffer::append(this_01,(XMLCh *)XMLUni::fgXMLNSURIName);
            }
          }
          else {
            if (bbQName.fMgr._4_4_ < 1000) {
              local_90 = &remAttr;
            }
            else {
              iVar5 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                                (this->fMemoryManager,(long)bbQName.fMgr._4_4_ * 2 + 2);
              local_90 = (DOMNode **)CONCAT44(extraout_var_02,iVar5);
            }
            XMLString::subString
                      ((XMLCh *)local_90,pXVar6,0,(long)bbQName.fMgr._4_4_,this->fMemoryManager);
            bVar3 = XMLString::equals((XMLCh *)local_90,L"xmlns");
            if (bVar3) {
              XMLBuffer::append(this_01,(XMLCh *)XMLUni::fgXMLNSURIName);
            }
            else {
              XMLBuffer::append(this_01,(XMLCh *)XMLUni::fgXMLURIName);
            }
            if (999 < bbQName.fMgr._4_4_) {
              (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,local_90);
            }
          }
          pDVar1 = this->fDocument;
          pXVar8 = XMLBuffer::getRawBuffer(this_01);
          iVar5 = (*(pDVar1->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x53])
                            (pDVar1,pXVar8,pXVar6);
          elem = (DOMElement *)CONCAT44(extraout_var_03,iVar5);
          plVar9 = (long *)(**(code **)(*plVar7 + 0x1a0))(plVar7,elem);
          if (plVar9 != (long *)0x0) {
            (**(code **)(*plVar9 + 0x138))();
          }
          XMLBufBid::~XMLBufBid((XMLBufBid *)&buf);
        }
        else {
          pDVar1 = this->fDocument;
          iVar5 = (*(this_00->super_XSerializable)._vptr_XSerializable[5])();
          iVar5 = (*(pDVar1->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x32])
                            (pDVar1,CONCAT44(extraout_var_04,iVar5));
          elem = (DOMElement *)CONCAT44(extraout_var_05,iVar5);
          plVar9 = (long *)(**(code **)(*plVar7 + 0x168))(plVar7,elem);
          if (plVar9 != (long *)0x0) {
            (**(code **)(*plVar9 + 0x138))();
          }
        }
        pXVar6 = XMLAttDef::getValue(this_00);
        (*(elem->super_DOMNode)._vptr_DOMNode[0x38])(elem,pXVar6);
        (*(elem->super_DOMNode)._vptr_DOMNode[0x33])(elem,0);
      }
    }
    iVar5 = (*(this->fDocumentType->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0x38])();
    plVar10 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_06,iVar5) + 0x10))
                                ((long *)CONCAT44(extraout_var_06,iVar5),plVar7);
    if (plVar10 != (long *)0x0) {
      (**(code **)(*plVar10 + 0x138))();
    }
  }
  return;
}

Assistant:

void AbstractDOMParser::endAttList
(
    const   DTDElementDecl& elemDecl
)
{
    if (fDocumentType->isIntSubsetReading())
    {
        //print the closing angle
        fInternalSubset.append(chCloseAngle);
    }

	// this section sets up default attributes.
	// default attribute nodes are stored in a NamedNodeMap DocumentTypeImpl::elements
	// default attribute data attached to the document is used to conform to the
	// DOM spec regarding creating element nodes & removing attributes with default values
	// see DocumentTypeImpl
	if (elemDecl.hasAttDefs())
	{
        XMLAttDefList* defAttrs = &elemDecl.getAttDefList();
        XMLAttDef* attr = 0;

        DOMAttrImpl * insertAttr = 0;
        DOMElement     *elem  = fDocument->createElement(elemDecl.getFullName());
        DOMElementImpl *elemImpl = (DOMElementImpl *) elem;
        bool doNamespaces = fScanner->getDoNamespaces();

        for(XMLSize_t i=0; i<defAttrs->getAttDefCount(); i++)
        {
            attr = &defAttrs->getAttDef(i);
            if (attr->getValue() != 0)
            {
                if (doNamespaces)
                {
                    // DOM Level 2 wants all namespace declaration attributes
                    // to be bound to "http://www.w3.org/2000/xmlns/"
                    // So as long as the XML parser doesn't do it, it needs to
                    // done here.
                    const XMLCh* qualifiedName = attr->getFullName();
                    int index = DOMDocumentImpl::indexofQualifiedName(qualifiedName);

                    XMLBufBid bbQName(&fBufMgr);
                    XMLBuffer& buf = bbQName.getBuffer();
                    static const XMLCh XMLNS[] = {
                        chLatin_x, chLatin_m, chLatin_l, chLatin_n, chLatin_s, chNull};

                    if (index > 0) {
                        // there is prefix
                        // map to XML URI for all cases except when prefix == "xmlns"
                        XMLCh* prefix;
                        XMLCh temp[1000];

                        if (index > 999)
                            prefix = (XMLCh*) fMemoryManager->allocate
                            (
                                (index + 1) * sizeof(XMLCh)
                            );//new XMLCh[index+1];
                        else
                            prefix = temp;

                        XMLString::subString(prefix ,qualifiedName, 0, index, fMemoryManager);

                        if (XMLString::equals(prefix,XMLNS))
                            buf.append(XMLUni::fgXMLNSURIName);
                        else
                            buf.append(XMLUni::fgXMLURIName);

                        if (index > 999)
                            fMemoryManager->deallocate(prefix);//delete [] prefix;
                    }
                    else {
                        //   No prefix
                        if (XMLString::equals(qualifiedName,XMLNS))
                            buf.append(XMLUni::fgXMLNSURIName);
                    }

                    insertAttr = (DOMAttrImpl *) fDocument->createAttributeNS(
                       buf.getRawBuffer(),     // NameSpaceURI
                       qualifiedName);   // qualified name

                    DOMNode* remAttr = elemImpl->setAttributeNodeNS(insertAttr);
                    if (remAttr)
                        remAttr->release();
                }
                else
                {
                    // Namespaces is turned off...
                    insertAttr = (DOMAttrImpl *) fDocument->createAttribute(attr->getFullName());
                    DOMNode* remAttr = elemImpl->setAttributeNode(insertAttr);
                    if (remAttr)
                        remAttr->release();
                }

                insertAttr->setValueFast(attr->getValue());
                insertAttr->setSpecified(false);
            }
        }
        DOMNode* rem = fDocumentType->getElements()->setNamedItem(elemImpl);
        if (rem)
            rem->release();
    }
}